

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_ND_C.cpp
# Opt level: O1

void amrex::EB2::intercept_to_edge_centroid
               (Array4<double> *excent,Array4<double> *eycent,Array4<double> *ezcent,
               Array4<const_unsigned_int> *fx,Array4<const_unsigned_int> *fy,
               Array4<const_unsigned_int> *fz,Array4<const_double> *levset,GpuArray<double,_3U> *dx,
               GpuArray<double,_3U> *problo)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  long local_a8;
  long local_a0;
  long local_98;
  
  dVar23 = dx->arr[1];
  dVar1 = dx->arr[2];
  iVar2 = (excent->begin).z;
  local_a8 = (long)iVar2;
  iVar3 = (excent->end).z;
  if (iVar2 < iVar3) {
    dVar25 = dx->arr[0];
    iVar2 = (excent->end).x;
    iVar4 = (excent->end).y;
    iVar5 = (excent->begin).y;
    iVar6 = (excent->begin).x;
    lVar11 = (long)iVar6;
    local_98 = 0;
    do {
      if (iVar5 < iVar4) {
        lVar19 = fx->jstride * 4;
        lVar20 = (long)fx->p +
                 ((long)iVar5 - (long)(fx->begin).y) * lVar19 +
                 (local_a8 - (fx->begin).z) * fx->kstride * 4 + (long)(fx->begin).x * -4 +
                 lVar11 * 4;
        lVar15 = 0;
        lVar21 = (long)iVar5;
        do {
          if (iVar6 < iVar2) {
            pdVar9 = levset->p;
            lVar13 = (lVar21 - (levset->begin).y) * levset->jstride;
            iVar16 = (levset->begin).x;
            lVar14 = (local_a8 - (levset->begin).z) * levset->kstride;
            lVar12 = excent->jstride * lVar15 + excent->kstride * local_98;
            pdVar10 = excent->p;
            lVar17 = 0;
            do {
              iVar7 = *(int *)(lVar20 + lVar17 * 4);
              if (iVar7 == 1) {
                *(undefined8 *)((long)pdVar10 + lVar17 * 8 + lVar12) = 0xbff0000000000000;
              }
              else if (iVar7 == 0) {
                *(undefined8 *)((long)pdVar10 + lVar17 * 8 + lVar12) = 0x3ff0000000000000;
              }
              else {
                dVar24 = (*(double *)((long)pdVar10 + lVar17 * 8 + lVar12) -
                         ((double)(iVar6 + (int)lVar17) * dx->arr[0] + problo->arr[0])) * 0.5 *
                         (1.0 / dVar25);
                uVar22 = -(ulong)(pdVar9[lVar11 + ((lVar14 + lVar13 + lVar17) - (long)iVar16)] <
                                 pdVar9[lVar13 + lVar14 + (((iVar6 + 1) - iVar16) + (int)lVar17)]);
                dVar24 = (double)((ulong)(dVar24 + -0.5) & uVar22 | ~uVar22 & (ulong)dVar24);
                if (dVar24 <= -0.5) {
                  dVar24 = -0.5;
                }
                if (0.5 <= dVar24) {
                  dVar24 = 0.5;
                }
                *(double *)((long)pdVar10 + lVar17 * 8 + lVar12) = dVar24;
              }
              lVar17 = lVar17 + 1;
            } while (iVar2 - lVar11 != lVar17);
          }
          lVar21 = lVar21 + 1;
          lVar20 = lVar20 + lVar19;
          lVar15 = lVar15 + 8;
        } while (lVar21 != iVar4);
      }
      local_a8 = local_a8 + 1;
      local_98 = local_98 + 8;
    } while (local_a8 != iVar3);
  }
  iVar2 = (eycent->begin).z;
  local_a8 = (long)iVar2;
  iVar3 = (eycent->end).z;
  if (iVar2 < iVar3) {
    iVar2 = (eycent->end).x;
    iVar4 = (eycent->end).y;
    iVar5 = (eycent->begin).y;
    iVar6 = (eycent->begin).x;
    lVar11 = (long)iVar6;
    local_98 = 0;
    do {
      if (iVar5 < iVar4) {
        lVar20 = fy->jstride * 4;
        lVar19 = (long)fy->p +
                 ((long)iVar5 - (long)(fy->begin).y) * lVar20 +
                 (local_a8 - (fy->begin).z) * fy->kstride * 4 + (long)(fy->begin).x * -4 +
                 lVar11 * 4;
        lVar15 = 0;
        lVar21 = (long)iVar5;
        iVar16 = iVar5;
        do {
          iVar16 = iVar16 + 1;
          if (iVar6 < iVar2) {
            iVar7 = (levset->begin).y;
            lVar13 = eycent->jstride * lVar15 + eycent->kstride * local_98;
            lVar17 = levset->jstride * 8;
            lVar14 = (local_a8 - (levset->begin).z) * levset->kstride;
            lVar12 = (long)(levset->begin).x;
            pdVar9 = eycent->p;
            pdVar10 = levset->p;
            lVar18 = 0;
            do {
              iVar8 = *(int *)(lVar19 + lVar18 * 4);
              if (iVar8 == 1) {
                *(undefined8 *)((long)pdVar9 + lVar18 * 8 + lVar13) = 0xbff0000000000000;
              }
              else if (iVar8 == 0) {
                *(undefined8 *)((long)pdVar9 + lVar18 * 8 + lVar13) = 0x3ff0000000000000;
              }
              else {
                dVar25 = (*(double *)((long)pdVar9 + lVar18 * 8 + lVar13) -
                         (dx->arr[1] * (double)(int)lVar21 + problo->arr[1])) * 0.5 * (1.0 / dVar23)
                ;
                uVar22 = -(ulong)(*(double *)
                                   ((long)pdVar10 +
                                   lVar18 * 8 +
                                   (lVar21 - iVar7) * lVar17 + lVar14 * 8 + lVar12 * -8 + lVar11 * 8
                                   ) < *(double *)
                                        ((long)pdVar10 +
                                        lVar18 * 8 +
                                        (iVar16 - iVar7) * lVar17 + lVar14 * 8 + lVar12 * -8 +
                                        lVar11 * 8));
                dVar25 = (double)((ulong)(dVar25 + -0.5) & uVar22 | ~uVar22 & (ulong)dVar25);
                if (dVar25 <= -0.5) {
                  dVar25 = -0.5;
                }
                if (0.5 <= dVar25) {
                  dVar25 = 0.5;
                }
                *(double *)((long)pdVar9 + lVar18 * 8 + lVar13) = dVar25;
              }
              lVar18 = lVar18 + 1;
            } while (iVar2 - lVar11 != lVar18);
          }
          lVar21 = lVar21 + 1;
          lVar19 = lVar19 + lVar20;
          lVar15 = lVar15 + 8;
        } while (lVar21 != iVar4);
      }
      local_a8 = local_a8 + 1;
      local_98 = local_98 + 8;
    } while (local_a8 != iVar3);
  }
  iVar2 = (ezcent->begin).z;
  local_a0 = (long)iVar2;
  iVar3 = (ezcent->end).z;
  if (iVar2 < iVar3) {
    iVar4 = (ezcent->end).x;
    iVar5 = (ezcent->end).y;
    iVar6 = (ezcent->begin).y;
    iVar16 = (ezcent->begin).x;
    lVar11 = (long)iVar16;
    local_98 = 0;
    do {
      iVar2 = iVar2 + 1;
      if (iVar6 < iVar5) {
        lVar19 = fz->jstride * 4;
        lVar20 = (long)fz->p +
                 ((long)iVar6 - (long)(fz->begin).y) * lVar19 +
                 (local_a0 - (fz->begin).z) * fz->kstride * 4 + (long)(fz->begin).x * -4 +
                 lVar11 * 4;
        lVar15 = 0;
        lVar21 = (long)iVar6;
        do {
          if (iVar16 < iVar4) {
            iVar7 = (levset->begin).z;
            lVar14 = ezcent->jstride * lVar15 + ezcent->kstride * local_98;
            lVar13 = levset->kstride * 8;
            lVar17 = (lVar21 - (levset->begin).y) * levset->jstride;
            lVar12 = (long)(levset->begin).x;
            pdVar9 = ezcent->p;
            pdVar10 = levset->p;
            lVar18 = 0;
            do {
              iVar8 = *(int *)(lVar20 + lVar18 * 4);
              if (iVar8 == 1) {
                *(undefined8 *)((long)pdVar9 + lVar18 * 8 + lVar14) = 0xbff0000000000000;
              }
              else if (iVar8 == 0) {
                *(undefined8 *)((long)pdVar9 + lVar18 * 8 + lVar14) = 0x3ff0000000000000;
              }
              else {
                dVar23 = (*(double *)((long)pdVar9 + lVar18 * 8 + lVar14) -
                         (dx->arr[2] * (double)(int)local_a0 + problo->arr[2])) * 0.5 *
                         (1.0 / dVar1);
                uVar22 = -(ulong)(*(double *)
                                   ((long)pdVar10 +
                                   lVar18 * 8 +
                                   (local_a0 - iVar7) * lVar13 + lVar17 * 8 + lVar12 * -8 +
                                   lVar11 * 8) <
                                 *(double *)
                                  ((long)pdVar10 +
                                  lVar18 * 8 +
                                  (iVar2 - iVar7) * lVar13 + lVar17 * 8 + lVar12 * -8 + lVar11 * 8))
                ;
                dVar23 = (double)((ulong)(dVar23 + -0.5) & uVar22 | ~uVar22 & (ulong)dVar23);
                if (dVar23 <= -0.5) {
                  dVar23 = -0.5;
                }
                if (0.5 <= dVar23) {
                  dVar23 = 0.5;
                }
                *(double *)((long)pdVar9 + lVar18 * 8 + lVar14) = dVar23;
              }
              lVar18 = lVar18 + 1;
            } while (iVar4 - lVar11 != lVar18);
          }
          lVar21 = lVar21 + 1;
          lVar20 = lVar20 + lVar19;
          lVar15 = lVar15 + 8;
        } while (lVar21 != iVar5);
      }
      local_a0 = local_a0 + 1;
      local_98 = local_98 + 8;
    } while (local_a0 != iVar3);
  }
  return;
}

Assistant:

void intercept_to_edge_centroid (AMREX_D_DECL(Array4<Real> const& excent,
                                              Array4<Real> const& eycent,
                                              Array4<Real> const& ezcent),
                                 AMREX_D_DECL(Array4<Type_t const> const& fx,
                                              Array4<Type_t const> const& fy,
                                              Array4<Type_t const> const& fz),
                                 Array4<Real const> const& levset,
                                 GpuArray<Real,AMREX_SPACEDIM> const& dx,
                                 GpuArray<Real,AMREX_SPACEDIM> const& problo) noexcept
{
    AMREX_D_TERM(const Real dxinv = Real(1.0)/dx[0];,
                 const Real dyinv = Real(1.0)/dx[1];,
                 const Real dzinv = Real(1.0)/dx[2];)
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
        Box(excent), xbx, {
            AMREX_LOOP_3D(xbx, i, j, k, {
                if (fx(i,j,k) == Type::regular) {
                    excent(i,j,k) = Real(1.0);
                } else if (fx(i,j,k) == Type::covered) {
                    excent(i,j,k) = Real(-1.0);
                } else {
                    Real xcut = Real(0.5)*(excent(i,j,k) - (problo[0]+i*dx[0]))*dxinv;
                    if (levset(i,j,k) < levset(i+1,j,k)) { // right side covered
                        xcut -= Real(0.5);
                    }
                    excent(i,j,k) = amrex::min(Real(0.5),amrex::max(Real(-0.5),xcut));
                }